

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O3

void bcwrite_proto(BCWriteCtx *ctx,GCproto *pt)

{
  double dVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  MSize i;
  uint uVar9;
  MSize MVar10;
  GCproto *pt_00;
  uint32_t uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint *puVar16;
  ulong uVar17;
  cTValue *pcVar18;
  
  if (((pt->flags & 1) != 0) && (uVar14 = pt->sizekgc, (ulong)uVar14 != 0)) {
    uVar13 = (pt->k).ptr32;
    lVar15 = 0;
    do {
      pt_00 = (GCproto *)(ulong)*(uint *)(((ulong)uVar13 - 4) + lVar15 * 4);
      if (pt_00->gct == '\a') {
        bcwrite_proto(ctx,pt_00);
      }
      lVar15 = lVar15 + -1;
    } while (-lVar15 != (ulong)uVar14);
  }
  MVar10 = (uint)pt->sizeuv * 2 + pt->sizebc * 4 + 0x23;
  uVar14 = (ctx->sb).b.ptr32;
  pcVar7 = (char *)(ulong)uVar14;
  if ((ctx->sb).e.ptr32 - uVar14 < MVar10) {
    pcVar7 = lj_buf_need2(&ctx->sb,MVar10);
  }
  pcVar7[5] = pt->flags & 7;
  pcVar7[6] = pt->numparams;
  pcVar7[7] = pt->framesize;
  pcVar7[8] = pt->sizeuv;
  pcVar7 = lj_strfmt_wuleb128(pcVar7 + 9,pt->sizekgc);
  pcVar7 = lj_strfmt_wuleb128(pcVar7,pt->sizekn);
  pcVar7 = lj_strfmt_wuleb128(pcVar7,pt->sizebc - 1);
  if (ctx->strip == 0) {
    uVar11 = (pt->lineinfo).ptr32;
    if (uVar11 == 0) {
      uVar14 = 0;
      uVar11 = 0;
    }
    else {
      iVar12 = (int)pt - uVar11;
      MVar10 = pt->sizept;
      pcVar7 = lj_strfmt_wuleb128(pcVar7,iVar12 + MVar10);
      uVar14 = iVar12 + MVar10;
      if (uVar14 == 0) goto LAB_0012394c;
      pcVar7 = lj_strfmt_wuleb128(pcVar7,pt->firstline);
      uVar11 = pt->numline;
    }
    pcVar7 = lj_strfmt_wuleb128(pcVar7,uVar11);
  }
  else {
LAB_0012394c:
    uVar14 = 0;
  }
  MVar10 = pt->sizebc;
  uVar8 = (ulong)(MVar10 * 4 - 4);
  memcpy(pcVar7,&pt[1].marked,uVar8);
  if ((pt->flags & 0x10) == 0) {
    if (MVar10 == 1 || pt->trace == 0) goto LAB_00123a46;
  }
  else if (MVar10 == 1) goto LAB_00123a46;
  uVar13 = *(uint *)((ulong)(ctx->sb).L.ptr32 + 8);
  lVar15 = 0;
  do {
    uVar6 = (byte)pcVar7[lVar15 * 4] - 0x4e;
    if (uVar6 < 10) {
      if ((0x125U >> (uVar6 & 0x1f) & 1) == 0) {
        if ((0x248U >> (uVar6 & 0x1f) & 1) != 0) {
          *(undefined4 *)(pcVar7 + lVar15 * 4) =
               *(undefined4 *)
                ((ulong)*(uint *)(*(long *)((ulong)uVar13 + 0x3b8) +
                                 (ulong)*(ushort *)(pcVar7 + lVar15 * 4 + 2) * 4) + 0x38);
        }
      }
      else {
        pcVar7[lVar15 * 4] = pcVar7[lVar15 * 4] - 1;
      }
    }
    lVar15 = lVar15 + 1;
  } while (MVar10 - 1 != (int)lVar15);
LAB_00123a46:
  bVar2 = pt->sizeuv;
  memcpy(pcVar7 + uVar8,(void *)(ulong)(pt->uv).ptr32,(ulong)((uint)bVar2 + (uint)bVar2));
  uVar6 = (int)(pcVar7 + uVar8) + (uint)bVar2 * 2;
  (ctx->sb).p.ptr32 = uVar6;
  uVar13 = pt->sizekgc;
  if ((ulong)uVar13 != 0) {
    puVar16 = (uint *)((ulong)(pt->k).ptr32 + (ulong)uVar13 * -4);
    uVar6 = 0;
    do {
      uVar8 = (ulong)*puVar16;
      cVar3 = *(char *)(uVar8 + 5);
      if (cVar3 == '\n') {
        MVar10 = 0x15;
        if (*(short *)(uVar8 + 6) == 0xb) {
          uVar9 = 2;
        }
        else if (*(short *)(uVar8 + 6) == 0xc) {
          uVar9 = 3;
        }
        else {
          uVar9 = 4;
        }
      }
      else {
        uVar9 = 0;
        MVar10 = 1;
        if (cVar3 != '\a') {
          if (cVar3 == '\x04') {
            uVar9 = *(int *)(uVar8 + 0xc) + 5;
            MVar10 = uVar9;
          }
          else {
            MVar10 = 0xb;
            uVar9 = 1;
          }
        }
      }
      uVar4 = (ctx->sb).p.ptr32;
      pcVar7 = (char *)(ulong)uVar4;
      if ((ctx->sb).e.ptr32 - uVar4 < MVar10) {
        pcVar7 = lj_buf_more2(&ctx->sb,MVar10);
      }
      pcVar7 = lj_strfmt_wuleb128(pcVar7,uVar9);
      if (uVar9 < 5) {
        if (uVar9 == 0) goto LAB_00123bb4;
        if (uVar9 != 1) {
          pcVar7 = lj_strfmt_wuleb128(pcVar7,*(uint32_t *)(uVar8 + 8));
          pcVar7 = lj_strfmt_wuleb128(pcVar7,*(uint32_t *)(uVar8 + 0xc));
          if (uVar9 == 4) {
            pcVar7 = lj_strfmt_wuleb128(pcVar7,*(uint32_t *)(uVar8 + 0x10));
            pcVar7 = lj_strfmt_wuleb128(pcVar7,*(uint32_t *)(uVar8 + 0x14));
          }
          goto LAB_00123bb4;
        }
        uVar11 = 0;
        uVar17 = 0;
        if ((ulong)*(uint *)(uVar8 + 0x18) != 0) {
          uVar5 = (ulong)*(uint *)(uVar8 + 0x18);
          do {
            uVar17 = uVar5;
            if ((long)uVar17 < 1) {
              uVar17 = 0;
              break;
            }
            uVar5 = uVar17 - 1;
          } while (*(int *)(((ulong)*(uint *)(uVar8 + 8) - 4) + uVar17 * 8) == -1);
        }
        iVar12 = *(int *)(uVar8 + 0x1c);
        if (iVar12 != 0) {
          lVar15 = 0;
          uVar11 = 0;
          do {
            uVar11 = uVar11 + (*(int *)((ulong)*(uint *)(uVar8 + 0x14) + 4 + lVar15) != -1);
            lVar15 = lVar15 + 0x18;
          } while ((ulong)(iVar12 + 1 + (uint)(iVar12 == -1)) * 0x18 != lVar15);
        }
        pcVar7 = lj_strfmt_wuleb128(pcVar7,(uint32_t)uVar17);
        pcVar7 = lj_strfmt_wuleb128(pcVar7,uVar11);
        (ctx->sb).p.ptr32 = (uint32_t)pcVar7;
        if ((uint32_t)uVar17 != 0) {
          pcVar18 = (cTValue *)(ulong)*(uint *)(uVar8 + 8);
          do {
            bcwrite_ktabk(ctx,pcVar18,1);
            pcVar18 = pcVar18 + 1;
            uVar9 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar9;
          } while (uVar9 != 0);
        }
        if (uVar11 != 0) {
          pcVar18 = (cTValue *)
                    ((ulong)*(uint *)(uVar8 + 0x14) + (ulong)*(uint *)(uVar8 + 0x1c) * 0x18 + 8);
          do {
            if (*(int *)((long)pcVar18 + -4) != -1) {
              bcwrite_ktabk(ctx,pcVar18,0);
              bcwrite_ktabk(ctx,pcVar18 + -1,1);
              uVar11 = uVar11 - 1;
              if (uVar11 == 0) break;
            }
            pcVar18 = pcVar18 + -3;
          } while( true );
        }
      }
      else {
        uVar9 = *(uint *)(uVar8 + 0xc);
        memcpy(pcVar7,(void *)(uVar8 + 0x10),(ulong)uVar9);
        pcVar7 = pcVar7 + uVar9;
LAB_00123bb4:
        (ctx->sb).p.ptr32 = (uint32_t)pcVar7;
      }
      uVar6 = uVar6 + 1;
      puVar16 = puVar16 + 1;
    } while (uVar6 != uVar13);
    uVar6 = (ctx->sb).p.ptr32;
  }
  uVar8 = (ulong)(pt->k).ptr32;
  MVar10 = pt->sizekn;
  if ((ctx->sb).e.ptr32 - uVar6 < MVar10 * 10) {
    pcVar7 = lj_buf_more2(&ctx->sb,MVar10 * 10);
  }
  else {
    pcVar7 = (char *)(ulong)uVar6;
  }
  if (MVar10 != 0) {
    lVar15 = 0;
    do {
      dVar1 = *(double *)(uVar8 + lVar15 * 8);
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
        pcVar7 = lj_strfmt_wuleb128(pcVar7,(SUB84(dVar1,0) & 0x80000000 | SUB84(dVar1,0) * 2) + 1);
        iVar12 = *(int *)(uVar8 + lVar15 * 8);
        if (iVar12 < 0) {
          pcVar7[-1] = (byte)((uint)iVar12 >> 0x1b) & 0x18 | pcVar7[-1] & 7U;
        }
        pcVar7 = lj_strfmt_wuleb128(pcVar7,*(uint32_t *)(uVar8 + 4 + lVar15 * 8));
      }
      else {
        uVar13 = (uint)dVar1;
        pcVar7 = lj_strfmt_wuleb128(pcVar7,uVar13 & 0x80000000 | uVar13 * 2);
        if ((int)uVar13 < 0) {
          pcVar7[-1] = (byte)(uVar13 >> 0x1b) & 0x18 | pcVar7[-1] & 7U;
        }
      }
      lVar15 = lVar15 + 1;
    } while (MVar10 != (MSize)lVar15);
  }
  uVar11 = (uint32_t)pcVar7;
  (ctx->sb).p.ptr32 = uVar11;
  if (uVar14 != 0) {
    if ((ctx->sb).e.ptr32 - uVar11 < uVar14) {
      pcVar7 = lj_buf_more2(&ctx->sb,uVar14);
    }
    else {
      pcVar7 = (char *)((ulong)pcVar7 & 0xffffffff);
    }
    memcpy(pcVar7,(void *)(ulong)(pt->lineinfo).ptr32,(ulong)uVar14);
    uVar11 = (int)pcVar7 + uVar14;
    (ctx->sb).p.ptr32 = uVar11;
  }
  if (ctx->status == 0) {
    uVar13 = (ctx->sb).b.ptr32;
    iVar12 = uVar11 - uVar13;
    uVar14 = iVar12 - 5;
    uVar6 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    pcVar7 = (char *)((ulong)(5 - ((uVar6 ^ 0xffffffe0) * 9 + 0x168 >> 6)) + (ulong)uVar13);
    lj_strfmt_wuleb128(pcVar7,uVar14);
    iVar12 = (*ctx->wfunc)((lua_State *)(ctx->sb).L.ptr32,pcVar7,(long)iVar12 + 0xfffffffb,
                           ctx->wdata);
    ctx->status = iVar12;
  }
  return;
}

Assistant:

static void bcwrite_proto(BCWriteCtx *ctx, GCproto *pt)
{
  MSize sizedbg = 0;
  char *p;

  /* Recursively write children of prototype. */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO)
	bcwrite_proto(ctx, gco2pt(o));
    }
  }

  /* Start writing the prototype info to a buffer. */
  p = lj_buf_need(&ctx->sb,
		  5+4+6*5+(pt->sizebc-1)*(MSize)sizeof(BCIns)+pt->sizeuv*2);
  p += 5;  /* Leave room for final size. */

  /* Write prototype header. */
  *p++ = (pt->flags & (PROTO_CHILD|PROTO_VARARG|PROTO_FFI));
  *p++ = pt->numparams;
  *p++ = pt->framesize;
  *p++ = pt->sizeuv;
  p = lj_strfmt_wuleb128(p, pt->sizekgc);
  p = lj_strfmt_wuleb128(p, pt->sizekn);
  p = lj_strfmt_wuleb128(p, pt->sizebc-1);
  if (!ctx->strip) {
    if (proto_lineinfo(pt))
      sizedbg = pt->sizept - (MSize)((char *)proto_lineinfo(pt) - (char *)pt);
    p = lj_strfmt_wuleb128(p, sizedbg);
    if (sizedbg) {
      p = lj_strfmt_wuleb128(p, pt->firstline);
      p = lj_strfmt_wuleb128(p, pt->numline);
    }
  }

  /* Write bytecode instructions and upvalue refs. */
  p = bcwrite_bytecode(ctx, p, pt);
  p = lj_buf_wmem(p, proto_uv(pt), pt->sizeuv*2);
  setsbufP(&ctx->sb, p);

  /* Write constants. */
  bcwrite_kgc(ctx, pt);
  bcwrite_knum(ctx, pt);

  /* Write debug info, if not stripped. */
  if (sizedbg) {
    p = lj_buf_more(&ctx->sb, sizedbg);
    p = lj_buf_wmem(p, proto_lineinfo(pt), sizedbg);
    setsbufP(&ctx->sb, p);
  }

  /* Pass buffer to writer function. */
  if (ctx->status == 0) {
    MSize n = sbuflen(&ctx->sb) - 5;
    MSize nn = (lj_fls(n)+8)*9 >> 6;
    char *q = sbufB(&ctx->sb) + (5 - nn);
    p = lj_strfmt_wuleb128(q, n);  /* Fill in final size. */
    lj_assertBCW(p == sbufB(&ctx->sb) + 5, "bad ULEB128 write");
    ctx->status = ctx->wfunc(sbufL(&ctx->sb), q, nn+n, ctx->wdata);
  }
}